

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# URL.cpp
# Opt level: O2

string * __thiscall URL::GetFullURL_abi_cxx11_(string *__return_storage_ptr__,URL *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  return __return_storage_ptr__;
}

Assistant:

std::string URL::GetFullURL() {
  return _url;
}